

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceSystemMock.cpp
# Opt level: O3

void __thiscall ResourceSystemMock::~ResourceSystemMock(ResourceSystemMock *this)

{
  if (_reserve.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*_reserve.super__Function_base._M_manager)
              ((_Any_data *)&_reserve,(_Any_data *)&_reserve,__destroy_functor);
    _reserve.super__Function_base._M_manager = (_Manager_type)0x0;
    _reserve._M_invoker = (_Invoker_type)0x0;
  }
  if (_free.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*_free.super__Function_base._M_manager)
              ((_Any_data *)&_free,(_Any_data *)&_free,__destroy_functor);
    _free.super__Function_base._M_manager = (_Manager_type)0x0;
    _free._M_invoker = (_Invoker_type)0x0;
  }
  testing::internal::FunctionMockerBase<void_(void_*)>::~FunctionMockerBase
            (&(this->gmockconst1_Resource_Free_12).super_FunctionMockerBase<void_(void_*)>);
  testing::internal::FunctionMockerBase<void_*(unsigned_long)>::~FunctionMockerBase
            ((FunctionMockerBase<void_*(unsigned_long)> *)this);
  return;
}

Assistant:

ResourceSystemMock::~ResourceSystemMock()
{
	_reserve = {};
	_free = {};
}